

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ticket_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  uint16_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    uVar1 = ssl_protocol_version(ssl_00);
    if (uVar1 < 0x304) {
      uVar2 = SSL_get_options(ssl_00);
      if ((uVar2 & 0x4000) != 0) {
        __assert_fail("(SSL_get_options(ssl) & SSL_OP_NO_TICKET) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x3c0,
                      "bool bssl::ext_ticket_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      sVar3 = CBS_len(contents);
      if (sVar3 == 0) {
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffeffff | 0x10000;
        hs_local._7_1_ = true;
      }
      else {
        hs_local._7_1_ = false;
      }
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ticket_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                         CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return false;
  }

  // If |SSL_OP_NO_TICKET| is set then no extension will have been sent and
  // this function should never be called, even if the server tries to send the
  // extension.
  assert((SSL_get_options(ssl) & SSL_OP_NO_TICKET) == 0);

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->ticket_expected = true;
  return true;
}